

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O2

bool tcu::pixelThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,Surface *reference,
               Surface *result,RGBA *threshold,CompareLogMode logMode)

{
  bool bVar1;
  RGBA local_a0 [4];
  UVec4 local_90;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  Surface::getAccess(&local_80,reference);
  Surface::getAccess(&local_58,result);
  RGBA::toIVec(local_a0);
  Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&local_90);
  bVar1 = intThresholdCompare(log,imageSetName,imageSetDesc,&local_80,&local_58,&local_90,logMode);
  return bVar1;
}

Assistant:

bool pixelThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const Surface& reference, const Surface& result, const RGBA& threshold, CompareLogMode logMode)
{
	return intThresholdCompare(log, imageSetName, imageSetDesc, reference.getAccess(), result.getAccess(), threshold.toIVec().cast<deUint32>(), logMode);
}